

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::sparse::anon_unknown_0::UBOTestInstance::iterate
          (TestStatus *__return_storage_ptr__,UBOTestInstance *this)

{
  Move<vk::Handle<(vk::HandleType)19>_> *this_00;
  Move<vk::Handle<(vk::HandleType)22>_> *this_01;
  byte bVar1;
  uint uVar2;
  DeviceDriver *vk;
  VkDevice pVVar3;
  undefined8 *puVar4;
  Allocation *pAVar5;
  VkDescriptorSetLayout descriptorSetLayout;
  PtrData<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  VkBufferCreateInfo referenceCreateInfo;
  VkBufferCreateInfo referenceCreateInfo_00;
  VkBufferCreateInfo referenceCreateInfo_01;
  pointer piVar6;
  VkPhysicalDeviceProperties *pVVar7;
  undefined4 *puVar8;
  DescriptorSetLayoutBuilder *this_02;
  DescriptorPoolBuilder *this_03;
  DescriptorSetUpdateBuilder *this_04;
  mapped_type *ppVVar9;
  Move<vk::Handle<(vk::HandleType)8>_> *pMVar10;
  deUint32 chunkOffset;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  deUint32 numChunks;
  UBOTestInstance *pUVar14;
  SparseAllocationBuilder *this_05;
  ulong uVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  UniquePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  minAllocation;
  pointer local_1a8;
  VkCommandPool VStack_1a0;
  VkBufferCreateInfo referenceBufferCreateInfo;
  SparseAllocationBuilder builder;
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  sparseAllocation;
  vector<int,_std::allocator<int>_> specializationData;
  VkCommandPool VStack_e0;
  Move<vk::Handle<(vk::HandleType)8>_> sparseBuffer;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> stagingBufferAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> sparseBufferAliased;
  key_type local_78 [4];
  ulong local_68;
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  local_60;
  
  vk = (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_deviceDriver.
       super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  sparseAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data.ptr = (SparseAllocation *)0x0;
  sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  sparseBufferAliased.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  sparseBufferAliased.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  sparseBufferAliased.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  sparseBufferAliased.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  referenceBufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  referenceBufferCreateInfo.pNext = (void *)0x0;
  referenceBufferCreateInfo.flags =
       (uint)(this->super_SparseBufferTestInstance).m_residency * 2 +
       (uint)(this->super_SparseBufferTestInstance).m_aliased * 4 + 1;
  referenceBufferCreateInfo.size = 0;
  referenceBufferCreateInfo.usage = 0x12;
  referenceBufferCreateInfo.queueFamilyIndexCount = 0;
  referenceBufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
  bVar16 = (this->super_SparseBufferTestInstance).m_sparseQueue.queueFamilyIndex !=
           (this->super_SparseBufferTestInstance).m_universalQueue.queueFamilyIndex;
  if (bVar16) {
    referenceBufferCreateInfo.queueFamilyIndexCount = 2;
    referenceBufferCreateInfo.pQueueFamilyIndices =
         (this->super_SparseBufferTestInstance).m_sharedQueueFamilyIndices;
  }
  referenceBufferCreateInfo.sharingMode = (VkSharingMode)bVar16;
  pUVar14 = this;
  SparseAllocationBuilder::SparseAllocationBuilder(&builder);
  SparseAllocationBuilder::addMemoryBind(&builder,(deUint32)pUVar14);
  referenceCreateInfo.sharingMode = referenceBufferCreateInfo.sharingMode;
  referenceCreateInfo.usage = referenceBufferCreateInfo.usage;
  referenceCreateInfo._44_4_ = referenceBufferCreateInfo._44_4_;
  referenceCreateInfo.queueFamilyIndexCount = referenceBufferCreateInfo.queueFamilyIndexCount;
  this_05 = &builder;
  referenceCreateInfo.pNext._0_4_ = (int)referenceBufferCreateInfo.pNext;
  referenceCreateInfo.sType = referenceBufferCreateInfo.sType;
  referenceCreateInfo._4_4_ = referenceBufferCreateInfo._4_4_;
  referenceCreateInfo.pNext._4_4_ = (int)((ulong)referenceBufferCreateInfo.pNext >> 0x20);
  referenceCreateInfo.flags = referenceBufferCreateInfo.flags;
  referenceCreateInfo._20_4_ = referenceBufferCreateInfo._20_4_;
  referenceCreateInfo.size = referenceBufferCreateInfo.size;
  referenceCreateInfo.pQueueFamilyIndices = referenceBufferCreateInfo.pQueueFamilyIndices;
  SparseAllocationBuilder::build
            ((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
              *)&specializationData,this_05,&vk->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_allocator.
             super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
             referenceCreateInfo,0x200);
  piVar6 = specializationData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  numChunks = (deUint32)this_05;
  specializationData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data.ptr = (SparseAllocation *)piVar6;
  de::details::
  UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::reset((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           *)&specializationData);
  SparseAllocationBuilder::~SparseAllocationBuilder(&builder);
  pVVar7 = Context::getDeviceProperties
                     ((this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                      super_TestInstance.m_context);
  uVar2 = (pVVar7->limits).maxUniformBufferRange;
  uVar15 = *(ulong *)(piVar6 + 2);
  de::details::
  UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::reset(&minAllocation.
           super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
         );
  if ((uint)(uVar2 / uVar15) < 4) {
    SparseAllocationBuilder::SparseAllocationBuilder(&builder);
    SparseAllocationBuilder::addMemoryBind(&builder,numChunks);
    referenceCreateInfo_00.sharingMode = referenceBufferCreateInfo.sharingMode;
    referenceCreateInfo_00.usage = referenceBufferCreateInfo.usage;
    referenceCreateInfo_00._44_4_ = referenceBufferCreateInfo._44_4_;
    referenceCreateInfo_00.queueFamilyIndexCount = referenceBufferCreateInfo.queueFamilyIndexCount;
    uVar18 = SUB84(referenceBufferCreateInfo.pNext,0);
    uVar19 = (undefined4)((ulong)referenceBufferCreateInfo.pNext >> 0x20);
    referenceCreateInfo_00.pNext._0_4_ = uVar18;
    referenceCreateInfo_00.sType = referenceBufferCreateInfo.sType;
    referenceCreateInfo_00._4_4_ = referenceBufferCreateInfo._4_4_;
    referenceCreateInfo_00.pNext._4_4_ = uVar19;
    referenceCreateInfo_00.flags = referenceBufferCreateInfo.flags;
    referenceCreateInfo_00._20_4_ = referenceBufferCreateInfo._20_4_;
    referenceCreateInfo_00.size = referenceBufferCreateInfo.size;
    referenceCreateInfo_00.pQueueFamilyIndices = referenceBufferCreateInfo.pQueueFamilyIndices;
    uVar17 = referenceBufferCreateInfo._0_8_;
    SparseAllocationBuilder::build
              ((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                *)&minAllocation,&builder,&vk->super_DeviceInterface,
               (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
               m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_allocator.
               super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
               referenceCreateInfo_00,0x200);
  }
  else {
    SparseAllocationBuilder::SparseAllocationBuilder(&builder);
    SparseAllocationBuilder::addMemoryBind(&builder,numChunks);
    if ((this->super_SparseBufferTestInstance).m_residency == true) {
      builder.m_resourceChunkNdx = builder.m_resourceChunkNdx + 1;
    }
    SparseAllocationBuilder::addMemoryAllocation(&builder);
    builder.m_memoryChunkNdx = builder.m_memoryChunkNdx + 1;
    builder.m_chunksPerAllocation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[builder._0_8_ & 0xffffffff] =
         builder.m_chunksPerAllocation.
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[builder._0_8_ & 0xffffffff] + 1;
    SparseAllocationBuilder::addMemoryBind(&builder,numChunks);
    if ((this->super_SparseBufferTestInstance).m_aliased == true) {
      SparseAllocationBuilder::addAliasedMemoryBind
                (&builder,numChunks,chunkOffset,
                 (deUint32)
                 builder.m_chunksPerAllocation.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    referenceCreateInfo_01.sharingMode = referenceBufferCreateInfo.sharingMode;
    referenceCreateInfo_01.usage = referenceBufferCreateInfo.usage;
    referenceCreateInfo_01._44_4_ = referenceBufferCreateInfo._44_4_;
    referenceCreateInfo_01.queueFamilyIndexCount = referenceBufferCreateInfo.queueFamilyIndexCount;
    uVar18 = SUB84(referenceBufferCreateInfo.pNext,0);
    uVar19 = (undefined4)((ulong)referenceBufferCreateInfo.pNext >> 0x20);
    referenceCreateInfo_01.pNext._0_4_ = uVar18;
    referenceCreateInfo_01.sType = referenceBufferCreateInfo.sType;
    referenceCreateInfo_01._4_4_ = referenceBufferCreateInfo._4_4_;
    referenceCreateInfo_01.pNext._4_4_ = uVar19;
    referenceCreateInfo_01.flags = referenceBufferCreateInfo.flags;
    referenceCreateInfo_01._20_4_ = referenceBufferCreateInfo._20_4_;
    referenceCreateInfo_01.size = referenceBufferCreateInfo.size;
    referenceCreateInfo_01.pQueueFamilyIndices = referenceBufferCreateInfo.pQueueFamilyIndices;
    uVar17 = referenceBufferCreateInfo._0_8_;
    SparseAllocationBuilder::build
              ((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                *)&minAllocation,&builder,&vk->super_DeviceInterface,
               (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
               m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_allocator.
               super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
               referenceCreateInfo_01,0x200);
  }
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data.ptr = (SparseAllocation *)0x0;
  data._8_4_ = uVar18;
  data.ptr = (SparseAllocation *)uVar17;
  data._12_4_ = uVar19;
  de::details::
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::operator=(&sparseAllocation,data);
  de::details::
  UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::reset(&minAllocation.
           super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
         );
  SparseAllocationBuilder::~SparseAllocationBuilder(&builder);
  referenceBufferCreateInfo.size =
       (sparseAllocation.
        super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
        .m_data.ptr)->resourceSize;
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&minAllocation,&vk->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             &referenceBufferCreateInfo);
  builder.m_memoryBinds.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_start = local_1a8;
  builder.m_memoryBinds.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)VStack_1a0.m_internal;
  builder._0_8_ =
       minAllocation.
       super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
       .m_data.ptr;
  builder.m_memoryChunkNdx =
       minAllocation.
       super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
       .m_data._8_4_;
  builder._12_4_ =
       minAllocation.
       super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
       .m_data._12_4_;
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data.ptr = (SparseAllocation *)0x0;
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)
       builder.m_memoryBinds.
       super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
       ._M_impl.super__Vector_impl_data._M_start;
  sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       builder.m_memoryBinds.
       super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_ =
       builder.m_allocationNdx;
  sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._4_4_ =
       builder.m_resourceChunkNdx;
  sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)builder._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&minAllocation);
  bindSparseBuffer(&vk->super_DeviceInterface,
                   (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                   m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (this->super_SparseBufferTestInstance).m_sparseQueue.queueHandle,
                   (VkBuffer)
                   sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                   m_internal,
                   sparseAllocation.
                   super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                   .m_data.ptr);
  bVar1 = (this->super_SparseBufferTestInstance).m_aliased;
  if ((bool)bVar1 == true) {
    makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&minAllocation,&vk->super_DeviceInterface,
               (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
               m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               &referenceBufferCreateInfo);
    builder.m_memoryBinds.
    super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    builder.m_memoryBinds.
    super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    builder._0_8_ =
         minAllocation.
         super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
         .m_data.ptr;
    builder.m_memoryChunkNdx =
         minAllocation.
         super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
         .m_data._8_4_;
    builder._12_4_ =
         minAllocation.
         super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
         .m_data._12_4_;
    minAllocation.
    super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
    .m_data.ptr = (SparseAllocation *)0x0;
    minAllocation.
    super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
    .m_data._8_8_ = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
              (&sparseBufferAliased.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    sparseBufferAliased.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)
         builder.m_memoryBinds.
         super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
         ._M_impl.super__Vector_impl_data._M_start;
    sparseBufferAliased.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         builder.m_memoryBinds.
         super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    sparseBufferAliased.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_
         = builder.m_allocationNdx;
    sparseBufferAliased.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._4_4_
         = builder.m_resourceChunkNdx;
    sparseBufferAliased.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)builder._8_8_;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&minAllocation);
    bindSparseBuffer(&vk->super_DeviceInterface,
                     (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                     m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                     (this->super_SparseBufferTestInstance).m_sparseQueue.queueHandle,
                     (VkBuffer)
                     sparseBufferAliased.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object
                     .m_internal,
                     sparseAllocation.
                     super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                     .m_data.ptr);
    bVar1 = (this->super_SparseBufferTestInstance).m_aliased;
  }
  if ((bVar1 & 1) == 0) {
    uVar15 = (sparseAllocation.
              super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
              .m_data.ptr)->resourceSize;
    uVar13 = 0;
  }
  else {
    uVar15 = (sparseAllocation.
              super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
              .m_data.ptr)->resourceSize;
    uVar13 = uVar15 / (sparseAllocation.
                       super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                       .m_data.ptr)->numResourceChunks;
    if ((ulong)(((long)((sparseAllocation.
                         super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                         .m_data.ptr)->memoryBinds).
                       super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)((sparseAllocation.
                        super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                        .m_data.ptr)->memoryBinds).
                      super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28) < 2) {
      uVar13 = 0;
    }
  }
  uVar15 = uVar15 - uVar13;
  pVVar3 = (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_logicalDevice.
           super_RefBase<vk::VkDevice_s_*>.m_data.object;
  makeBufferCreateInfo((VkBufferCreateInfo *)&builder,uVar15,1);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&minAllocation,&vk->super_DeviceInterface,
             pVVar3,(VkBufferCreateInfo *)&builder);
  referenceBufferCreateInfo.flags = 0;
  referenceBufferCreateInfo._20_4_ = 0;
  referenceBufferCreateInfo.size = 0;
  referenceBufferCreateInfo._0_8_ =
       minAllocation.
       super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
       .m_data.ptr;
  referenceBufferCreateInfo.pNext =
       (void *)minAllocation.
               super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
               .m_data._8_8_;
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data.ptr = (SparseAllocation *)0x0;
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&minAllocation);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&builder,
             &vk->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_allocator.
             super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
             (VkBuffer)referenceBufferCreateInfo._0_8_,(MemoryRequirement)0x1);
  stagingBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)builder._0_8_;
  builder.m_allocationNdx = 0;
  builder.m_resourceChunkNdx = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&builder);
  puVar8 = (undefined4 *)
           ((long)(stagingBufferAlloc.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                  ->m_hostPtr + 0xc);
  for (lVar11 = 0; (uVar15 >> 4 & 0xffffffff) * 3 != lVar11; lVar11 = lVar11 + 3) {
    puVar8[-3] = (uint)lVar11 ^ 0x7f;
    *(undefined8 *)(puVar8 + -2) = 0;
    *puVar8 = 0;
    puVar8 = puVar8 + 4;
  }
  ::vk::flushMappedMemoryRange
            (&vk->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkDeviceMemory)
             ((stagingBufferAlloc.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (stagingBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,uVar15);
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_68 = uVar15;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&minAllocation,&vk->super_DeviceInterface
                  ,(this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                   m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                  (this->super_SparseBufferTestInstance).m_universalQueue.queueFamilyIndex);
  builder.m_memoryBinds.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.m_memoryBinds.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder._0_8_ =
       minAllocation.
       super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
       .m_data.ptr;
  builder.m_memoryChunkNdx =
       minAllocation.
       super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
       .m_data._8_4_;
  builder._12_4_ =
       minAllocation.
       super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
       .m_data._12_4_;
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data.ptr = (SparseAllocation *)0x0;
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&minAllocation);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&specializationData,&vk->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkCommandPool)builder._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  piVar6 = specializationData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data.ptr = (SparseAllocation *)
                specializationData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data._8_8_ =
       specializationData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  specializationData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  specializationData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  specializationData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&specializationData);
  beginCommandBuffer(&vk->super_DeviceInterface,
                     (VkCommandBuffer)
                     minAllocation.
                     super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                     .m_data.ptr);
  (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x5f])
            (vk,minAllocation.
                super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                .m_data.ptr,referenceBufferCreateInfo._0_8_,
             sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  endCommandBuffer(&vk->super_DeviceInterface,
                   (VkCommandBuffer)
                   minAllocation.
                   super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                   .m_data.ptr);
  uVar18 = 0;
  uVar17 = 0;
  submitCommandsAndWait
            (&vk->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (this->super_SparseBufferTestInstance).m_universalQueue.queueHandle,
             (VkCommandBuffer)
             minAllocation.
             super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
             .m_data.ptr,0,(VkSemaphore *)0x0,(VkPipelineStageFlags *)0x0,0,(VkSemaphore *)0x0);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&minAllocation);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&builder);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&stagingBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&referenceBufferCreateInfo);
  uVar15 = (sparseAllocation.
            super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
            .m_data.ptr)->resourceSize;
  pVVar7 = Context::getDeviceProperties
                     ((this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                      super_TestInstance.m_context);
  uVar2 = (pVVar7->limits).maxUniformBufferRange;
  uVar13 = (ulong)uVar2;
  if ((uint)uVar15 < uVar2) {
    uVar13 = uVar15 & 0xffffffff;
  }
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&builder);
  this_02 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)&builder,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x10
                      );
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&minAllocation,this_02,
             &vk->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,0);
  referenceBufferCreateInfo._16_8_ = piVar6;
  referenceBufferCreateInfo.size = VStack_e0.m_internal;
  referenceBufferCreateInfo._0_8_ =
       minAllocation.
       super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
       .m_data.ptr;
  referenceBufferCreateInfo.pNext =
       (void *)minAllocation.
               super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
               .m_data._8_8_;
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data.ptr = (SparseAllocation *)0x0;
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data._8_8_ = 0;
  this_00 = &this->m_descriptorSetLayout;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_device = (VkDevice)referenceBufferCreateInfo._16_8_;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)referenceBufferCreateInfo.size;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
       referenceBufferCreateInfo._0_8_;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)referenceBufferCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&minAllocation);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&builder);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&minAllocation);
  this_03 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&minAllocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&referenceBufferCreateInfo,this_03,
             &vk->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,1,1);
  builder.m_memoryBinds.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)referenceBufferCreateInfo._16_8_;
  builder.m_memoryBinds.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)referenceBufferCreateInfo.size;
  builder.m_allocationNdx = referenceBufferCreateInfo.sType;
  builder.m_resourceChunkNdx = referenceBufferCreateInfo._4_4_;
  builder._8_8_ = referenceBufferCreateInfo.pNext;
  referenceBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  referenceBufferCreateInfo._4_4_ = 0;
  referenceBufferCreateInfo.pNext = (void *)0x0;
  referenceBufferCreateInfo.flags = 0;
  referenceBufferCreateInfo._20_4_ = 0;
  referenceBufferCreateInfo.size = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
            (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)
       builder.m_memoryBinds.
       super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)
         builder.m_memoryBinds.
         super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       builder._0_8_;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)builder._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&referenceBufferCreateInfo);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&minAllocation);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&referenceBufferCreateInfo,
                    &vk->super_DeviceInterface,
                    (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                    m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                    (VkDescriptorPool)
                    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                    object.m_internal,
                    (VkDescriptorSetLayout)
                    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                    m_data.object.m_internal);
  builder.m_memoryBinds.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)referenceBufferCreateInfo._16_8_;
  builder.m_memoryBinds.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)referenceBufferCreateInfo.size;
  builder.m_allocationNdx = referenceBufferCreateInfo.sType;
  builder.m_resourceChunkNdx = referenceBufferCreateInfo._4_4_;
  builder._8_8_ = referenceBufferCreateInfo.pNext;
  referenceBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  referenceBufferCreateInfo._4_4_ = 0;
  referenceBufferCreateInfo.pNext = (void *)0x0;
  referenceBufferCreateInfo.flags = 0;
  referenceBufferCreateInfo._20_4_ = 0;
  referenceBufferCreateInfo.size = 0;
  this_01 = &this->m_descriptorSet;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)
       builder.m_memoryBinds.
       super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
  m_internal = (deUint64)
               builder.m_memoryBinds.
               super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal = builder._0_8_
  ;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)builder._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&referenceBufferCreateInfo);
  pMVar10 = &sparseBuffer;
  if ((this->super_SparseBufferTestInstance).m_aliased != false) {
    pMVar10 = &sparseBufferAliased;
  }
  referenceBufferCreateInfo._0_8_ =
       (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
  referenceBufferCreateInfo.pNext = (void *)0x0;
  referenceBufferCreateInfo._16_8_ = uVar13;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&builder);
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data.ptr = (SparseAllocation *)0x0;
  this_04 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)&builder,
                       (VkDescriptorSet)
                       (this_01->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.
                       m_internal,(Location *)&minAllocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                       (VkDescriptorBufferInfo *)&referenceBufferCreateInfo);
  ::vk::DescriptorSetUpdateBuilder::update
            (this_04,&vk->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&builder);
  pVVar3 = (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_logicalDevice.
           super_RefBase<vk::VkDevice_s_*>.m_data.object;
  makeBufferCreateInfo((VkBufferCreateInfo *)&builder,0x40,0x80);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&minAllocation,&vk->super_DeviceInterface,
             pVVar3,(VkBufferCreateInfo *)&builder);
  referenceBufferCreateInfo.flags = 0;
  referenceBufferCreateInfo._20_4_ = 0;
  referenceBufferCreateInfo.size = 0;
  referenceBufferCreateInfo._0_8_ =
       minAllocation.
       super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
       .m_data.ptr;
  referenceBufferCreateInfo.pNext =
       (void *)minAllocation.
               super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
               .m_data._8_8_;
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data.ptr = (SparseAllocation *)0x0;
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)referenceBufferCreateInfo._16_8_;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)referenceBufferCreateInfo.size;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       referenceBufferCreateInfo._0_8_;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)referenceBufferCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&minAllocation);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&builder,
             &vk->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_allocator.
             super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
             (VkBuffer)
             (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,(MemoryRequirement)0x1);
  builder.m_allocationNdx = 0;
  builder.m_resourceChunkNdx = 0;
  data_00._8_4_ = uVar18;
  data_00.ptr = (Allocation *)uVar17;
  data_00._12_4_ = uVar19;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&(this->m_vertexBufferAlloc).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data_00);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&builder);
  puVar4 = (undefined8 *)
           ((this->m_vertexBufferAlloc).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  *puVar4 = 0xbf800000bf800000;
  puVar4[1] = 0x3f80000000000000;
  puVar4[2] = 0x3f800000bf800000;
  puVar4[3] = 0x3f80000000000000;
  puVar4[4] = 0xbf8000003f800000;
  puVar4[5] = 0x3f80000000000000;
  puVar4[6] = &DAT_3f8000003f800000;
  puVar4[7] = 0x3f80000000000000;
  pAVar5 = (this->m_vertexBufferAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::flushMappedMemoryRange
            (&vk->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkDeviceMemory)(pAVar5->m_memory).m_internal,pAVar5->m_offset,0x40);
  specializationData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  specializationData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  specializationData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar12 = (uint)uVar13 >> 4;
  uVar2 = (sparseAllocation.
           super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           .m_data.ptr)->numResourceChunks;
  builder.m_allocationNdx = uVar12;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&specializationData,(int *)&builder);
  builder.m_allocationNdx = uVar12 / uVar2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&specializationData,(int *)&builder);
  referenceBufferCreateInfo.flags = 2;
  referenceBufferCreateInfo._20_4_ = 4;
  referenceBufferCreateInfo.size = 4;
  referenceBufferCreateInfo.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  referenceBufferCreateInfo._4_4_ = 0;
  referenceBufferCreateInfo.pNext = (void *)0x4;
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data.ptr = (SparseAllocation *)
                CONCAT44(minAllocation.
                         super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                         .m_data.ptr._4_4_,2);
  builder.m_memoryBinds.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&builder.m_memoryChunkNdx;
  builder._8_8_ = builder._8_8_ & 0xffffffff00000000;
  builder.m_memoryBinds.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.m_chunksPerAllocation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78[0] = 0x10;
  minAllocation.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data._8_8_ = &referenceBufferCreateInfo;
  builder.m_memoryBinds.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       builder.m_memoryBinds.
       super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ppVVar9 = std::
            map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
            ::operator[]((map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
                          *)&builder,local_78);
  *ppVVar9 = (mapped_type)&minAllocation;
  descriptorSetLayout.m_internal =
       (this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
              *)&builder);
  SparseBufferTestInstance::draw
            (&this->super_SparseBufferTestInstance,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,
             descriptorSetLayout,(SpecializationMap *)&local_60);
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::~_Rb_tree((_Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
               *)&builder);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&specializationData.super__Vector_base<int,_std::allocator<int>_>);
  SparseBufferTestInstance::verifyDrawResult
            (__return_storage_ptr__,&this->super_SparseBufferTestInstance);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&sparseBufferAliased.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  de::details::
  UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::reset(&sparseAllocation.
           super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
         );
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const DeviceInterface&		vk					= getDeviceInterface();
		MovePtr<SparseAllocation>	sparseAllocation;
		Move<VkBuffer>				sparseBuffer;
		Move<VkBuffer>				sparseBufferAliased;

		// Set up the sparse buffer
		{
			VkBufferCreateInfo	referenceBufferCreateInfo	= getSparseBufferCreateInfo(VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);
			const VkDeviceSize	minChunkSize				= 512u;	// make sure the smallest allocation is at least this big
			deUint32			numMaxChunks				= 0u;

			// Check how many chunks we can allocate given the alignment and size requirements of UBOs
			{
				const UniquePtr<SparseAllocation> minAllocation(SparseAllocationBuilder()
					.addMemoryBind()
					.build(vk, getDevice(), getAllocator(), referenceBufferCreateInfo, minChunkSize));

				numMaxChunks = deMaxu32(static_cast<deUint32>(m_context.getDeviceProperties().limits.maxUniformBufferRange / minAllocation->resourceSize), 1u);
			}

			if (numMaxChunks < 4)
			{
				sparseAllocation = SparseAllocationBuilder()
					.addMemoryBind()
					.build(vk, getDevice(), getAllocator(), referenceBufferCreateInfo, minChunkSize);
			}
			else
			{
				// Try to use a non-trivial memory allocation scheme to make it different from a non-sparse binding
				SparseAllocationBuilder builder;
				builder.addMemoryBind();

				if (m_residency)
					builder.addResourceHole();

				builder
					.addMemoryAllocation()
					.addMemoryHole()
					.addMemoryBind();

				if (m_aliased)
					builder.addAliasedMemoryBind(0u, 0u);

				sparseAllocation = builder.build(vk, getDevice(), getAllocator(), referenceBufferCreateInfo, minChunkSize);
				DE_ASSERT(sparseAllocation->resourceSize <= m_context.getDeviceProperties().limits.maxUniformBufferRange);
			}

			// Create the buffer
			referenceBufferCreateInfo.size	= sparseAllocation->resourceSize;
			sparseBuffer					= makeBuffer(vk, getDevice(), referenceBufferCreateInfo);
			bindSparseBuffer(vk, getDevice(), m_sparseQueue.queueHandle, *sparseBuffer, *sparseAllocation);

			if (m_aliased)
			{
				sparseBufferAliased = makeBuffer(vk, getDevice(), referenceBufferCreateInfo);
				bindSparseBuffer(vk, getDevice(), m_sparseQueue.queueHandle, *sparseBufferAliased, *sparseAllocation);
			}
		}

		// Set uniform data
		{
			const bool					hasAliasedChunk		= (m_aliased && sparseAllocation->memoryBinds.size() > 1u);
			const VkDeviceSize			chunkSize			= sparseAllocation->resourceSize / sparseAllocation->numResourceChunks;
			const VkDeviceSize			stagingBufferSize	= sparseAllocation->resourceSize - (hasAliasedChunk ? chunkSize : 0);
			const deUint32				numBufferEntries	= static_cast<deUint32>(stagingBufferSize / sizeof(IVec4));

			const Unique<VkBuffer>		stagingBuffer		(makeBuffer(vk, getDevice(), makeBufferCreateInfo(stagingBufferSize, VK_BUFFER_USAGE_TRANSFER_SRC_BIT)));
			const UniquePtr<Allocation>	stagingBufferAlloc	(bindBuffer(vk, getDevice(), getAllocator(), *stagingBuffer, MemoryRequirement::HostVisible));

			{
				// If aliased chunk is used, the staging buffer is smaller than the sparse buffer and we don't overwrite the last chunk
				IVec4* const pData = static_cast<IVec4*>(stagingBufferAlloc->getHostPtr());
				for (deUint32 i = 0; i < numBufferEntries; ++i)
					pData[i] = IVec4(3*i ^ 127, 0, 0, 0);

				flushMappedMemoryRange(vk, getDevice(), stagingBufferAlloc->getMemory(), stagingBufferAlloc->getOffset(), stagingBufferSize);

				const VkBufferCopy copyRegion =
				{
					0ull,						// VkDeviceSize    srcOffset;
					0ull,						// VkDeviceSize    dstOffset;
					stagingBufferSize,			// VkDeviceSize    size;
				};

				const Unique<VkCommandPool>		cmdPool		(makeCommandPool(vk, getDevice(), m_universalQueue.queueFamilyIndex));
				const Unique<VkCommandBuffer>	cmdBuffer	(allocateCommandBuffer(vk, getDevice(), *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

				beginCommandBuffer	(vk, *cmdBuffer);
				vk.cmdCopyBuffer	(*cmdBuffer, *stagingBuffer, *sparseBuffer, 1u, &copyRegion);
				endCommandBuffer	(vk, *cmdBuffer);

				submitCommandsAndWait(vk, getDevice(), m_universalQueue.queueHandle, *cmdBuffer);
				// Once the fence is signaled, the write is also available to the aliasing buffer.
			}
		}

		// Make sure that we don't try to access a larger range than is allowed. This only applies to a single chunk case.
		const deUint32 maxBufferRange = deMinu32(static_cast<deUint32>(sparseAllocation->resourceSize), m_context.getDeviceProperties().limits.maxUniformBufferRange);

		// Descriptor sets
		{
			m_descriptorSetLayout = DescriptorSetLayoutBuilder()
				.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_FRAGMENT_BIT)
				.build(vk, getDevice());

			m_descriptorPool = DescriptorPoolBuilder()
				.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER)
				.build(vk, getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

			m_descriptorSet = makeDescriptorSet(vk, getDevice(), *m_descriptorPool, *m_descriptorSetLayout);

			const VkBuffer					buffer				= (m_aliased ? *sparseBufferAliased : *sparseBuffer);
			const VkDescriptorBufferInfo	sparseBufferInfo	= makeDescriptorBufferInfo(buffer, 0ull, maxBufferRange);

			DescriptorSetUpdateBuilder()
				.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &sparseBufferInfo)
				.update(vk, getDevice());
		}

		// Vertex data
		{
			const Vec4 vertexData[] =
			{
				Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
				Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
				Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
				Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
			};

			const VkDeviceSize	vertexBufferSize	= sizeof(vertexData);

			m_vertexBuffer		= makeBuffer(vk, getDevice(), makeBufferCreateInfo(vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
			m_vertexBufferAlloc	= bindBuffer(vk, getDevice(), getAllocator(), *m_vertexBuffer, MemoryRequirement::HostVisible);

			deMemcpy(m_vertexBufferAlloc->getHostPtr(), &vertexData[0], vertexBufferSize);
			flushMappedMemoryRange(vk, getDevice(), m_vertexBufferAlloc->getMemory(), m_vertexBufferAlloc->getOffset(), vertexBufferSize);
		}

		// Draw
		{
			std::vector<deInt32> specializationData;
			{
				const deUint32	numBufferEntries	= maxBufferRange / static_cast<deUint32>(sizeof(IVec4));
				const deUint32	numEntriesPerChunk	= numBufferEntries / sparseAllocation->numResourceChunks;

				specializationData.push_back(numBufferEntries);
				specializationData.push_back(numEntriesPerChunk);
			}

			const VkSpecializationMapEntry	specMapEntries[] =
			{
				{
					1u,					// uint32_t    constantID;
					0u,					// uint32_t    offset;
					sizeof(deInt32),	// size_t      size;
				},
				{
					2u,					// uint32_t    constantID;
					sizeof(deInt32),	// uint32_t    offset;
					sizeof(deInt32),	// size_t      size;
				},
			};

			const VkSpecializationInfo specInfo =
			{
				DE_LENGTH_OF_ARRAY(specMapEntries),		// uint32_t                           mapEntryCount;
				specMapEntries,							// const VkSpecializationMapEntry*    pMapEntries;
				sizeInBytes(specializationData),		// size_t                             dataSize;
				getDataOrNullptr(specializationData),	// const void*                        pData;
			};

			Renderer::SpecializationMap	specMap;
			specMap[VK_SHADER_STAGE_FRAGMENT_BIT] = &specInfo;

			draw(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP, *m_descriptorSetLayout, specMap);
		}

		return verifyDrawResult();
	}